

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O3

ClippedEdge *
MutableS2ShapeIndex::UpdateBound
          (ClippedEdge *edge,int u_end,double u,int v_end,double v,EdgeAllocator *alloc)

{
  R2Rect *this;
  BasicVector<Vector2,_double,_2UL> *this_00;
  VType *pVVar1;
  bool bVar2;
  ClippedEdge *pCVar3;
  double *pdVar4;
  double dVar5;
  S2LogMessage local_40;
  
  pCVar3 = EdgeAllocator::NewClippedEdge(alloc);
  pCVar3->face_edge = edge->face_edge;
  this = &pCVar3->bound;
  pdVar4 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                     ((BasicVector<Vector2,_double,_2UL> *)this,u_end);
  *pdVar4 = u;
  this_00 = (BasicVector<Vector2,_double,_2UL> *)((pCVar3->bound).bounds_ + 1);
  pdVar4 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[](this_00,v_end)
  ;
  *pdVar4 = v;
  dVar5 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&edge->bound,1 - u_end);
  pdVar4 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                     ((BasicVector<Vector2,_double,_2UL> *)this,1 - u_end);
  *pdVar4 = dVar5;
  dVar5 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)((edge->bound).bounds_ + 1),1 - v_end);
  pdVar4 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                     (this_00,1 - v_end);
  *pdVar4 = dVar5;
  dVar5 = (pCVar3->bound).bounds_[0].bounds_.c_[0];
  pVVar1 = (pCVar3->bound).bounds_[0].bounds_.c_ + 1;
  if (*pVVar1 <= dVar5 && dVar5 != *pVVar1) {
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
               ,0x4d6,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.stream_,"Check failed: !clipped->bound.is_empty() ",0x29);
  }
  else {
    bVar2 = R2Rect::Contains(&edge->bound,this);
    if (bVar2) {
      return pCVar3;
    }
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
               ,0x4d7,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.stream_,"Check failed: edge->bound.Contains(clipped->bound) ",0x33);
  }
  abort();
}

Assistant:

inline const MutableS2ShapeIndex::ClippedEdge*
MutableS2ShapeIndex::UpdateBound(const ClippedEdge* edge, int u_end, double u,
                                 int v_end, double v, EdgeAllocator* alloc) {
  ClippedEdge* clipped = alloc->NewClippedEdge();
  clipped->face_edge = edge->face_edge;
  clipped->bound[0][u_end] = u;
  clipped->bound[1][v_end] = v;
  clipped->bound[0][1-u_end] = edge->bound[0][1-u_end];
  clipped->bound[1][1-v_end] = edge->bound[1][1-v_end];
  S2_DCHECK(!clipped->bound.is_empty());
  S2_DCHECK(edge->bound.Contains(clipped->bound));
  return clipped;
}